

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferRenderInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,TexelBufferRenderInstance *this,
          ConstPixelBufferAccess *result)

{
  TestLog *log;
  bool bVar1;
  int fetchPosNdx;
  allocator<char> local_c9;
  ConstPixelBufferAccess local_c8;
  Vec4 sample3;
  Vec4 sample2;
  Vec4 sample1;
  Vec4 sample0;
  Surface reference;
  TextureFormat local_48;
  TextureFormat TStack_40;
  TextureFormat local_38;
  void *pvStack_30;
  
  local_38.order = R;
  local_38.type = 0x3f800000;
  pvStack_30 = (void *)0x3f80000000000000;
  local_48 = (TextureFormat)&DAT_3f8000003f800000;
  TStack_40.order = R;
  TStack_40.type = 0x3f800000;
  if (this->m_stageFlags == 0) {
    tcu::Vector<float,_4>::Vector(&sample0,(Vector<float,_4> *)&local_48);
    tcu::Vector<float,_4>::Vector(&sample1,(Vector<float,_4> *)&local_38);
    tcu::Vector<float,_4>::Vector(&sample2,(Vector<float,_4> *)&local_38);
    tcu::Vector<float,_4>::Vector(&sample3,(Vector<float,_4> *)&local_48);
  }
  else {
    fetchPosNdx = (int)this + 0x1f0;
    TexelBufferInstanceBuffers::fetchTexelValue((TexelBufferInstanceBuffers *)&sample0,fetchPosNdx);
    TexelBufferInstanceBuffers::fetchTexelValue((TexelBufferInstanceBuffers *)&sample1,fetchPosNdx);
    TexelBufferInstanceBuffers::fetchTexelValue((TexelBufferInstanceBuffers *)&sample2,fetchPosNdx);
    TexelBufferInstanceBuffers::fetchTexelValue((TexelBufferInstanceBuffers *)&sample3,fetchPosNdx);
  }
  tcu::Surface::Surface
            (&reference,
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[0],
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[1]);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_c8,&reference);
  drawQuadrantReferenceResult((PixelBufferAccess *)&local_c8,&sample0,&sample1,&sample2,&sample3);
  log = ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.super_TestInstance.
        m_context)->m_testCtx->m_log;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_c8,&reference);
  bVar1 = tcu::bilinearCompare
                    (log,"Compare","Result comparison",&local_c8,result,(RGBA)0x1010101,
                     COMPARE_LOG_RESULT);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Pass",&local_c9);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_c8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Image verification failed",&local_c9);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_c8);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  tcu::Surface::~Surface(&reference);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TexelBufferRenderInstance::verifyResultImage (const tcu::ConstPixelBufferAccess& result) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow		(1.0f, 1.0f, 0.0f, 1.0f);
	const bool			doFetch		= (m_stageFlags != 0u); // no active stages? Then don't fetch
	const tcu::Vec4		sample0		= (!doFetch) ? (yellow)	: (m_texelBuffers.fetchTexelValue(0));
	const tcu::Vec4		sample1		= (!doFetch) ? (green)	: (m_texelBuffers.fetchTexelValue(1));
	const tcu::Vec4		sample2		= (!doFetch) ? (green)	: (m_texelBuffers.fetchTexelValue(2));
	const tcu::Vec4		sample3		= (!doFetch) ? (yellow)	: (m_texelBuffers.fetchTexelValue(3));
	tcu::Surface		reference	(m_targetSize.x(), m_targetSize.y());

	drawQuadrantReferenceResult(reference.getAccess(), sample0, sample1, sample2, sample3);

	if (!bilinearCompare(m_context.getTestContext().getLog(), "Compare", "Result comparison", reference.getAccess(), result, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_RESULT))
		return tcu::TestStatus::fail("Image verification failed");
	else
		return tcu::TestStatus::pass("Pass");
}